

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

void __thiscall
pbrt::DisplayItem::DisplayItem
          (DisplayItem *this,string *baseTitle,Point2i resolution,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channelNames,
          function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *getTileValues)

{
  pointer pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer channelName;
  __pid_t local_74;
  undefined1 local_70 [32];
  pointer local_50;
  pointer local_40;
  
  this->openedImage = false;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  iVar3 = resolution.super_Tuple2<pbrt::Point2,_int>.x;
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.x = iVar3;
  iVar4 = resolution.super_Tuple2<pbrt::Point2,_int>.y;
  (this->resolution).super_Tuple2<pbrt::Point2,_int>.y = iVar4;
  std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::function
            (&this->getTileValues,getTileValues);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->channelNames,channelNames);
  (this->channelBuffers).
  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->channelBuffers).
  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->channelBuffers).
  super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_74 = getpid();
  local_70._8_8_ = (pointer)0x0;
  local_70[0x10] = '\0';
  local_70._0_8_ = local_70 + 0x10;
  detail::stringPrintfRecursive<std::__cxx11::string_const&,int>
            ((string *)local_70,"%s (%d)",baseTitle,&local_74);
  std::__cxx11::string::operator=((string *)&this->title,(string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
  }
  iVar2 = iVar3 + 0xfe;
  if (-1 < iVar3 + 0x7f) {
    iVar2 = iVar3 + 0x7f;
  }
  iVar3 = iVar4 + 0xfe;
  if (-1 < iVar4 + 0x7f) {
    iVar3 = iVar4 + 0x7f;
  }
  channelName = (channelNames->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (channelNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (channelName != pbVar1) {
    do {
      ImageChannelBuffer::ImageChannelBuffer
                ((ImageChannelBuffer *)local_70,channelName,(iVar3 >> 7) * (iVar2 >> 7),&this->title
                );
      std::
      vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
      ::emplace_back<pbrt::DisplayItem::ImageChannelBuffer>
                (&this->channelBuffers,(ImageChannelBuffer *)local_70);
      if (local_50 != (pointer)0x0) {
        operator_delete(local_50,(long)local_40 - (long)local_50);
      }
      if ((pointer)local_70._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_70._0_8_,
                        CONCAT71(local_70._17_7_,local_70[0x10]) - local_70._0_8_);
      }
      channelName = channelName + 1;
    } while (channelName != pbVar1);
  }
  return;
}

Assistant:

DisplayItem::DisplayItem(
    const std::string &baseTitle, Point2i resolution,
    std::vector<std::string> channelNames,
    std::function<void(Bounds2i b, pstd::span<pstd::span<Float>>)> getTileValues)
    : resolution(resolution), getTileValues(getTileValues), channelNames(channelNames) {
#ifdef PBRT_IS_WINDOWS
    title = StringPrintf("%s (%d)", baseTitle, GetCurrentThreadId());
#else
    title = StringPrintf("%s (%d)", baseTitle, getpid());
#endif

    int nTiles = ((resolution.x + tileSize - 1) / tileSize) *
                 ((resolution.y + tileSize - 1) / tileSize);

    for (const std::string &channelName : channelNames)
        channelBuffers.push_back(ImageChannelBuffer(channelName, nTiles, title));
}